

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass1<false>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  undefined1 *puVar1;
  uint32 *puVar2;
  undefined **ppuVar3;
  CharSetNode *pCVar4;
  code *pcVar5;
  bool bVar6;
  byte bVar7;
  undefined2 uVar8;
  bool bVar9;
  char cVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  codepoint_t codePointValue;
  uint uVar14;
  uint uVar15;
  undefined4 *puVar16;
  _func_int **pp_Var17;
  EncodedChar *pEVar18;
  ulong uVar19;
  Node *pNVar20;
  undefined4 extraout_var;
  Node *pNVar21;
  AltNode *pAVar22;
  AltNode *pAVar23;
  long *plVar24;
  _func_int **pp_Var25;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar26;
  ArenaAllocator *pAVar27;
  CharSet<unsigned_int> *this_00;
  MatchSetNode *node;
  uint totalCount;
  int iVar28;
  uint uVar29;
  CharSet<unsigned_int> *pCVar30;
  uint uVar31;
  long lVar32;
  NodeTag *pNVar33;
  Char CVar34;
  Char lc;
  AltNode *lastAltNode;
  undefined1 auVar35 [16];
  undefined1 local_920 [8];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  MatchSetNode local_3d0;
  undefined1 local_368 [8];
  CharSet<unsigned_int> codePointSet;
  OLECHAR local_88;
  CharSet<unsigned_int> *local_70;
  Char local_60;
  bool local_59;
  codepoint_t upperCharOfRange;
  bool previousWasASurrogate;
  CharSet<unsigned_int> *local_50;
  Parser<UTF8EncodingPolicyBase<false>,_false> *local_48;
  undefined4 *local_40;
  char local_31;
  
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_368);
  local_3d0.super_Node.tag = MatchSet;
  local_3d0.super_Node._10_8_ = 0;
  local_3d0.super_Node.firstSet._2_2_ = 0;
  local_3d0.super_Node._20_6_ = 0;
  local_3d0.super_Node.followSet._2_2_ = 0;
  local_3d0.super_Node._28_8_ = 0;
  local_3d0.super_Node.prevConsumes.upper = 0xffffffff;
  local_3d0.super_Node.thisConsumes.lower = 0;
  local_3d0.super_Node.thisConsumes.upper = 0xffffffff;
  local_3d0.super_Node.followConsumes.lower = 0;
  local_3d0.super_Node.followConsumes.upper = 0xffffffff;
  local_3d0.super_Node._vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
  local_3d0.isNegation = false;
  local_3d0.needsEquivClass = true;
  CharSet<char16_t>::CharSet(&local_3d0.set);
  pmovsxbd(ZEXT816(0),0xff00ff);
  codePointSet.characterPlanes[0x10].rep._32_8_ = &PTR_LiteralLength_01542a10;
  pp_Var17 = (_func_int **)this->inputLim;
  pp_Var25 = (_func_int **)this->next;
  local_48 = this;
  if (pp_Var17 < pp_Var25) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar16 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar9) goto LAB_00ecce8b;
    *puVar16 = 0;
    pp_Var17 = (_func_int **)local_48->inputLim;
    pp_Var25 = (_func_int **)local_48->next;
  }
  _upperCharOfRange = (Node *)&local_48->next;
  local_31 = *(char *)pp_Var25;
  if (local_31 == '^') {
    if (pp_Var17 < (_func_int **)((long)pp_Var25 + 1U)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar16 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar9) goto LAB_00ecce8b;
      *puVar16 = 0;
      pp_Var25 = _upperCharOfRange->_vptr_Node;
      if (*(char *)pp_Var25 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar9) goto LAB_00ecce8b;
        *puVar16 = 0;
        pp_Var25 = _upperCharOfRange->_vptr_Node;
      }
    }
    pp_Var25 = (_func_int **)((long)pp_Var25 + 1);
    local_48->next = (EncodedChar *)pp_Var25;
    pp_Var17 = (_func_int **)local_48->inputLim;
  }
  if (pp_Var25 <= pp_Var17) {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
LAB_00ecba25:
    local_70 = &codePointSet;
    cVar10 = *(char *)pp_Var25;
    local_59 = false;
    local_50 = (CharSet<unsigned_int> *)CONCAT44(local_50._4_4_,0xffffffff);
    CVar34 = 0xffffffff;
    bVar9 = false;
    bVar6 = false;
    do {
      pPVar26 = local_48;
      if (cVar10 == '-') {
        pEVar18 = local_48->inputLim;
        if (CVar34 == 0xffffffff || (Char)local_50 != -1) {
LAB_00ecbc97:
          if (pEVar18 < (EncodedChar *)((long)pp_Var25 + 1U)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pp_Var25 = _upperCharOfRange->_vptr_Node;
          }
          if (*(char *)pp_Var25 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                                "!this->IsMultiUnitChar(next[i])");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pp_Var25 = _upperCharOfRange->_vptr_Node;
          }
          _upperCharOfRange->_vptr_Node = (_func_int **)((long)pp_Var25 + 1);
          lc = 0x2d;
        }
        else {
          if (pEVar18 < (EncodedChar *)((long)pp_Var25 + 1U)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pEVar18 = local_48->inputLim;
            pp_Var25 = (_func_int **)local_48->next;
          }
          if (*(char *)((long)pp_Var25 + 1) == ']') goto LAB_00ecbc97;
          if (pEVar18 < (EncodedChar *)((long)pp_Var25 + 1U)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pp_Var25 = _upperCharOfRange->_vptr_Node;
          }
          if (*(char *)pp_Var25 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                                "!this->IsMultiUnitChar(next[i])");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pp_Var25 = _upperCharOfRange->_vptr_Node;
          }
          _upperCharOfRange->_vptr_Node = (_func_int **)((long)pp_Var25 + 1);
          local_50 = (CharSet<unsigned_int> *)CONCAT44(local_50._4_4_,CVar34);
          lc = CVar34;
          CVar34 = 0xffffffff;
        }
        bVar7 = 0;
        pPVar26 = local_48;
      }
      else {
        if (cVar10 == '\\') {
          if (local_48->inputLim < (EncodedChar *)((long)pp_Var25 + 1U)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pp_Var25 = _upperCharOfRange->_vptr_Node;
          }
          if (*(char *)pp_Var25 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                                "!this->IsMultiUnitChar(next[i])");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pp_Var25 = _upperCharOfRange->_vptr_Node;
          }
          pPVar26 = local_48;
          local_48->next = (EncodedChar *)((long)pp_Var25 + 1);
          pNVar20 = ClassEscapePass1(local_48,(MatchCharNode *)
                                              (codePointSet.characterPlanes[0x10].rep.full.direct.
                                               vec + 6),&local_3d0,&local_59);
          if (pNVar20->tag == MatchSet) {
            if ((Char)local_50 != -1) {
              if (pPVar26->unicodeFlagPresent == true) {
                Fail(pPVar26,-0x7ff5e9d3);
              }
              CharSet<unsigned_int>::SetRange
                        ((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator,0x2d,0x2d);
            }
            CharSet<unsigned_int>::UnionInPlace
                      ((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator,&local_3d0.set);
            local_50 = (CharSet<unsigned_int> *)CONCAT44(local_50._4_4_,0xffffffff);
            bVar7 = 1;
            lc = 0xffffffff;
            goto LAB_00ecbe28;
          }
          local_88 = L'\0';
        }
        else {
          if (cVar10 == ']') {
            if (CVar34 != 0xffffffff) {
              CharSet<unsigned_int>::SetRange
                        ((CharSet<unsigned_int> *)local_368,local_48->ctAllocator,CVar34,CVar34);
            }
            if (pPVar26->unicodeFlagPresent != false) {
              if (((pPVar26->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar16 = local_40;
                *local_40 = 1;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                   ,0x8e9,
                                   "(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                                   "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
                if (!bVar9) goto LAB_00ecce8b;
                *puVar16 = 0;
              }
              if (local_368 != (undefined1  [8])&DAT_00000001) goto LAB_00ecc0ee;
              uVar19 = 0xffffffffffffffff;
              plVar24 = (long *)((long)&codePointSet.characterPlanes[0].rep + 0x20);
              goto LAB_00ecc045;
            }
            if (&DAT_00000004 < (undefined1 *)((long)local_368 - 1U)) {
              if (local_368 == (undefined1  [8])0x0) {
                uVar12 = CharBitvec::Count((CharBitvec *)&codePointSet);
                local_50 = (CharSet<unsigned_int> *)CONCAT44(extraout_var,uVar12);
              }
              else {
                if ((local_368 != (undefined1  [8])&CharSetFull::Instance) &&
                   (uVar31 = (*(*(_func_int ***)local_368)[0xb])(local_368,2), 0xff00 < uVar31)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar16 = local_40;
                  *local_40 = 1;
                  bVar9 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                     ,0x252,
                                     "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                     ,
                                     "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                    );
                  if (!bVar9) goto LAB_00ecce8b;
                  *puVar16 = 0;
                }
                uVar12 = CharBitvec::Count((CharBitvec *)&codePointSet);
                if (local_368 == (undefined1  [8])&CharSetFull::Instance) {
                  iVar28 = 0xff00;
                }
                else {
                  iVar28 = (*(*(_func_int ***)local_368)[0xb])(local_368,2);
                }
                local_50 = (CharSet<unsigned_int> *)(ulong)(iVar28 + uVar12);
              }
            }
            else {
              local_50 = (CharSet<unsigned_int> *)(ulong)(local_368._0_4_ - 1);
            }
            lVar32 = 0;
            iVar28 = 0;
            goto LAB_00ecc637;
          }
          pp_Var17 = (_func_int **)local_48->inputLim;
          if (pp_Var17 <= pp_Var25) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar11 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x25d,"(!IsEOF())","!IsEOF()");
            if (!bVar11) goto LAB_00ecce8b;
            *puVar16 = 0;
            pp_Var17 = (_func_int **)pPVar26->inputLim;
          }
          local_88 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                               (&pPVar26->super_UTF8EncodingPolicyBase<false>,
                                (EncodedCharPtr *)_upperCharOfRange,(EncodedCharPtr)pp_Var17);
        }
        lc = (Char)(ushort)local_88;
        bVar7 = 0;
      }
LAB_00ecbe28:
      if (!(bool)(~bVar9 & CVar34 == 0xffffffff)) {
        if (bVar9) {
          if (pPVar26->unicodeFlagPresent == true) {
            Fail(pPVar26,-0x7ff5e9d3);
          }
          if (lc != 0xffffffff) {
            CharSet<unsigned_int>::SetRange
                      ((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator,lc,lc);
          }
          pAVar27 = pPVar26->ctAllocator;
          lc = 0x2d;
          CVar34 = 0x2d;
        }
        else {
          if ((Char)local_50 == 0xffffffff) {
            CharSet<unsigned_int>::SetRange
                      ((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator,CVar34,CVar34);
            local_50 = (CharSet<unsigned_int> *)CONCAT44(local_50._4_4_,0xffffffff);
            goto LAB_00ecbf14;
          }
          if (lc < (Char)local_50) {
            if (pPVar26->unicodeFlagPresent == true) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = local_40;
              *local_40 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
              if (!bVar9) goto LAB_00ecce8b;
              *puVar16 = 0;
            }
            Fail(pPVar26,-0x7ff5ec63);
          }
          pAVar27 = pPVar26->ctAllocator;
          CVar34 = (Char)local_50;
        }
        CharSet<unsigned_int>::SetRange((CharSet<unsigned_int> *)local_368,pAVar27,CVar34,lc);
        local_50 = (CharSet<unsigned_int> *)CONCAT44(local_50._4_4_,0xffffffff);
        lc = 0xffffffff;
      }
LAB_00ecbf14:
      CVar34 = lc;
      pp_Var25 = (_func_int **)pPVar26->next;
      if (pPVar26->inputLim < pp_Var25) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_40;
        *local_40 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar9) goto LAB_00ecce8b;
        *puVar16 = 0;
        pp_Var25 = _upperCharOfRange->_vptr_Node;
      }
      cVar10 = *(char *)pp_Var25;
      bVar9 = bVar6;
      bVar6 = (bool)(bVar7 & cVar10 == '-');
    } while( true );
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar16 = 1;
  bVar9 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
  if (bVar9) {
    local_40 = puVar16;
    *puVar16 = 0;
    pp_Var25 = _upperCharOfRange->_vptr_Node;
    goto LAB_00ecba25;
  }
  goto LAB_00ecce8b;
LAB_00ecc637:
  do {
    ppuVar3 = *(undefined ***)((long)codePointSet.characterPlanes + lVar32 + -8);
    if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
      if (ppuVar3 == (undefined **)0x0) {
        uVar12 = CharBitvec::Count((CharBitvec *)
                                   ((long)&codePointSet.characterPlanes[0].rep + lVar32));
      }
      else {
        if ((ppuVar3 != &CharSetFull::Instance) &&
           (uVar31 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar31)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = local_40;
          *local_40 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00ecce8b;
          *puVar16 = 0;
        }
        uVar12 = CharBitvec::Count((CharBitvec *)
                                   ((long)&codePointSet.characterPlanes[0].rep + lVar32));
        ppuVar3 = *(undefined ***)((long)codePointSet.characterPlanes + lVar32 + -8);
        if (ppuVar3 == &CharSetFull::Instance) {
          iVar13 = 0xff00;
        }
        else {
          iVar13 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
        }
        uVar12 = iVar13 + uVar12;
      }
    }
    else {
      uVar12 = (int)ppuVar3 - 1;
    }
    pPVar26 = local_48;
    iVar28 = iVar28 + uVar12;
    lVar32 = lVar32 + 0x28;
  } while (lVar32 != 0x2a8);
  if ((Char)local_50 != iVar28) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = local_40;
    *local_40 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                       "codePointSet.SimpleCharCount() == codePointSet.Count()");
    if (!bVar9) goto LAB_00ecce8b;
    *puVar16 = 0;
  }
  pNVar20 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar26->ctAllocator,0x364470);
  *(uint *)&pNVar20->field_0xc = *(uint *)&pNVar20->field_0xc & 0xffff8000;
  pNVar20->tag = MatchSet;
  pNVar20->features = 0;
  pNVar20->firstSet = (CharSet<char16_t> *)0x0;
  pNVar20->followSet = (CharSet<char16_t> *)0x0;
  (pNVar20->prevConsumes).lower = 0;
  auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
  *(undefined1 (*) [16])&(pNVar20->prevConsumes).upper = auVar35;
  (pNVar20->followConsumes).upper = 0xffffffff;
  pNVar20->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
  *(bool *)&pNVar20[1]._vptr_Node = local_31 == '^';
  *(undefined1 *)((long)&pNVar20[1]._vptr_Node + 1) = 1;
  pNVar33 = &pNVar20[1].tag;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar33);
  pAVar27 = pPVar26->ctAllocator;
  this_00 = (CharSet<unsigned_int> *)local_368;
LAB_00ecc7d7:
  CharSet<unsigned_int>::CloneSimpleCharsTo(this_00,pAVar27,(CharSet<char16_t> *)pNVar33);
  return pNVar20;
  while( true ) {
    uVar19 = uVar19 + 1;
    lVar32 = *plVar24;
    plVar24 = plVar24 + 5;
    if (lVar32 != 1) break;
LAB_00ecc045:
    if (uVar19 == 0xf) goto LAB_00ecc062;
  }
  if (0xf < uVar19) {
LAB_00ecc062:
    pNVar20 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar26->ctAllocator,0x364470);
    pNVar20->tag = MatchSet;
    pNVar20->features = 0;
    *(uint *)&pNVar20->field_0xc = *(uint *)&pNVar20->field_0xc & 0xffff8000;
    pNVar20->firstSet = (CharSet<char16_t> *)0x0;
    pNVar20->followSet = (CharSet<char16_t> *)0x0;
    (pNVar20->prevConsumes).lower = 0;
    auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar20->prevConsumes).upper = auVar35;
    (pNVar20->followConsumes).upper = 0xffffffff;
    pNVar20->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(undefined2 *)&pNVar20[1]._vptr_Node = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar20[1].tag);
    return pNVar20;
  }
LAB_00ecc0ee:
  if ((local_31 != '^') && (pPVar26->caseInsensitiveFlagPresent == false)) {
    lVar32 = 0;
    iVar28 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)codePointSet.characterPlanes + lVar32 + -8);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar12 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar31 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar31)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ecce8b;
            *puVar16 = 0;
          }
          uVar12 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
          ppuVar3 = *(undefined ***)((long)codePointSet.characterPlanes + lVar32 + -8);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar13 = 0xff00;
          }
          else {
            iVar13 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar12 = iVar13 + uVar12;
        }
      }
      else {
        uVar12 = (int)ppuVar3 - 1;
      }
      pPVar26 = local_48;
      iVar28 = iVar28 + uVar12;
      lVar32 = lVar32 + 0x28;
    } while (lVar32 != 0x2a8);
    if (iVar28 == 1) {
      codePointValue = CharSet<unsigned_int>::Singleton((CharSet<unsigned_int> *)local_368);
      if (codePointValue < 0x10000) {
        pNVar20 = (Node *)new<Memory::ArenaAllocator>(0x48,pPVar26->ctAllocator,0x364470);
        pNVar20->tag = MatchChar;
        pNVar20->features = 0;
        *(uint *)&pNVar20->field_0xc = *(uint *)&pNVar20->field_0xc & 0xffff8000;
        pNVar20->firstSet = (CharSet<char16_t> *)0x0;
        pNVar20->followSet = (CharSet<char16_t> *)0x0;
        (pNVar20->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar20->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar20->thisConsumes).upper = 0xffffffff;
        (pNVar20->followConsumes).upper = 0xffffffff;
        pNVar20->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542a10;
        *(undefined1 *)&pNVar20[1].tag = Empty;
        auVar35 = pshuflw(ZEXT416(codePointValue),ZEXT416(codePointValue),0);
        pNVar20[1]._vptr_Node = (_func_int **)auVar35._0_8_;
      }
      else {
        if (pPVar26->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = local_40;
          *local_40 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar9) goto LAB_00ecce8b;
          *puVar16 = 0;
        }
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (codePointValue,(char16 *)local_920,
                   (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
        pNVar20 = CreateSurrogatePairAtom
                            (pPVar26,local_920._0_2_,
                             negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
      }
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator);
      return pNVar20;
    }
  }
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_920);
  if (pPVar26->caseInsensitiveFlagPresent == false) {
    pCVar30 = (CharSet<unsigned_int> *)local_368;
    if (local_31 == '^') {
      CharSet<unsigned_int>::ToComplement
                ((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator,
                 (CharSet<unsigned_int> *)local_920);
      CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator);
      local_70 = &negatedSet;
      pCVar30 = (CharSet<unsigned_int> *)local_920;
    }
  }
  else {
    puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar2);
    CharSet<unsigned_int>::ToEquivClass
              ((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator,
               (CharSet<unsigned_int> *)puVar2);
    lVar32 = 0;
    uVar31 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar32 + 0x20);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar12 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar32));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar29 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar29)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ecce8b;
            *puVar16 = 0;
          }
          uVar12 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar32));
          ppuVar3 = *(undefined ***)((long)&negatedSet.characterPlanes[0x10].rep + lVar32 + 0x20);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar28 = 0xff00;
          }
          else {
            iVar28 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar12 = iVar28 + uVar12;
        }
      }
      else {
        uVar12 = (int)ppuVar3 - 1;
      }
      uVar31 = uVar31 + uVar12;
      lVar32 = lVar32 + 0x28;
    } while (lVar32 != 0x2a8);
    lVar32 = 0;
    uVar29 = 0;
    do {
      ppuVar3 = *(undefined ***)((long)codePointSet.characterPlanes + lVar32 + -8);
      if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
        if (ppuVar3 == (undefined **)0x0) {
          uVar12 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
        }
        else {
          if ((ppuVar3 != &CharSetFull::Instance) &&
             (uVar14 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar14)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = local_40;
            *local_40 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar9) goto LAB_00ecce8b;
            *puVar16 = 0;
          }
          uVar12 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar32));
          ppuVar3 = *(undefined ***)((long)codePointSet.characterPlanes + lVar32 + -8);
          if (ppuVar3 == &CharSetFull::Instance) {
            iVar28 = 0xff00;
          }
          else {
            iVar28 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
          }
          uVar12 = iVar28 + uVar12;
        }
      }
      else {
        uVar12 = (int)ppuVar3 - 1;
      }
      pPVar26 = local_48;
      uVar29 = uVar29 + uVar12;
      lVar32 = lVar32 + 0x28;
    } while (lVar32 != 0x2a8);
    if (uVar31 < uVar29) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = local_40;
      *local_40 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                         "caseEquivalent.Count() >= codePointSet.Count()");
      if (!bVar9) goto LAB_00ecce8b;
      *puVar16 = 0;
    }
    pCVar30 = (CharSet<unsigned_int> *)local_368;
    if (local_31 == '^') {
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator);
      puVar2 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::ToComplement
                ((CharSet<unsigned_int> *)puVar2,pPVar26->ctAllocator,
                 (CharSet<unsigned_int> *)local_368);
      CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)puVar2,pPVar26->ctAllocator);
    }
    else {
      CharSet<unsigned_int>::CloneFrom
                ((CharSet<unsigned_int> *)local_368,pPVar26->ctAllocator,
                 (CharSet<unsigned_int> *)(negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6)
                );
    }
  }
  lVar32 = 0;
  uVar12 = 0;
  local_50 = pCVar30;
  do {
    ppuVar3 = *(undefined ***)((long)&local_50->characterPlanes[0].rep + lVar32);
    if (&DAT_00000004 < (undefined1 *)((long)ppuVar3 + -1)) {
      if (ppuVar3 == (undefined **)0x0) {
        uVar15 = CharBitvec::Count((CharBitvec *)
                                   ((long)&pCVar30->characterPlanes[0].rep + lVar32 + 8));
      }
      else {
        if ((ppuVar3 != &CharSetFull::Instance) &&
           (uVar31 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2), 0xff00 < uVar31)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar16 = local_40;
          *local_40 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00ecce8b;
          *puVar16 = 0;
        }
        uVar15 = CharBitvec::Count((CharBitvec *)
                                   ((long)&pCVar30->characterPlanes[0].rep + lVar32 + 8));
        ppuVar3 = *(undefined ***)((long)&local_50->characterPlanes[0].rep + lVar32);
        if (ppuVar3 == &CharSetFull::Instance) {
          iVar28 = 0xff00;
        }
        else {
          iVar28 = (**(code **)(*ppuVar3 + 0x58))(ppuVar3,2);
        }
        uVar15 = iVar28 + uVar15;
      }
    }
    else {
      uVar15 = (int)ppuVar3 - 1;
    }
    this_00 = local_50;
    uVar12 = uVar12 + uVar15;
    lVar32 = lVar32 + 0x28;
  } while (lVar32 != 0x2a8);
  pCVar4 = local_50->characterPlanes[0].rep.full.root;
  if (&DAT_00000004 < (undefined1 *)((long)&pCVar4[-1]._vptr_CharSetNode + 7)) {
    if (pCVar4 == (CharSetNode *)0x0) {
      uVar15 = CharBitvec::Count((CharBitvec *)local_70);
    }
    else {
      if ((pCVar4 != (CharSetNode *)&CharSetFull::Instance) &&
         (uVar31 = (*pCVar4->_vptr_CharSetNode[0xb])(pCVar4,2), 0xff00 < uVar31)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_40;
        *local_40 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar9) goto LAB_00ecce8b;
        *puVar16 = 0;
      }
      uVar15 = CharBitvec::Count((CharBitvec *)local_70);
      pCVar4 = this_00->characterPlanes[0].rep.full.root;
      if (pCVar4 == (CharSetNode *)&CharSetFull::Instance) {
        iVar28 = 0xff00;
      }
      else {
        iVar28 = (*pCVar4->_vptr_CharSetNode[0xb])(pCVar4,2);
      }
      uVar15 = iVar28 + uVar15;
    }
  }
  else {
    uVar15 = (int)pCVar4 - 1;
  }
  pPVar26 = local_48;
  if (uVar12 == uVar15) {
    pNVar20 = (Node *)new<Memory::ArenaAllocator>(0x68,local_48->ctAllocator,0x364470);
    *(uint *)&pNVar20->field_0xc = *(uint *)&pNVar20->field_0xc & 0xffff8000;
    pNVar20->tag = MatchSet;
    pNVar20->features = 0;
    pNVar20->firstSet = (CharSet<char16_t> *)0x0;
    pNVar20->followSet = (CharSet<char16_t> *)0x0;
    (pNVar20->prevConsumes).lower = 0;
    auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar20->prevConsumes).upper = auVar35;
    (pNVar20->followConsumes).upper = 0xffffffff;
    pNVar20->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(bool *)&pNVar20[1]._vptr_Node = local_31 == '^';
    *(undefined1 *)((long)&pNVar20[1]._vptr_Node + 1) = 1;
    pNVar33 = &pNVar20[1].tag;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar33);
    pAVar27 = pPVar26->ctAllocator;
    goto LAB_00ecc7d7;
  }
  if (uVar15 == 0) {
    pNVar20 = (Node *)0x0;
LAB_00eccc32:
    pNVar21 = (Node *)0x0;
    pPVar26 = local_48;
  }
  else {
    negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_ = 0xffff;
    local_60 = local_60 & 0xffff0000;
    bVar9 = CharSet<char16_t>::GetNextRange
                      (this_00->characterPlanes,L'\xd800',
                       (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                       (Char *)&local_60);
    pPVar26 = local_48;
    uVar8 = negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_;
    pNVar20 = (Node *)new<Memory::ArenaAllocator>(0x68,local_48->ctAllocator,0x364470);
    pNVar20->tag = MatchSet;
    pNVar20->features = 0;
    *(uint *)&pNVar20->field_0xc = *(uint *)&pNVar20->field_0xc & 0xffff8000;
    pNVar20->firstSet = (CharSet<char16_t> *)0x0;
    pNVar20->followSet = (CharSet<char16_t> *)0x0;
    (pNVar20->prevConsumes).lower = 0;
    auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar20->prevConsumes).upper = auVar35;
    (pNVar20->followConsumes).upper = 0xffffffff;
    pNVar20->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(undefined2 *)&pNVar20[1]._vptr_Node = 0x100;
    pNVar33 = &pNVar20[1].tag;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar33);
    this_00 = local_50;
    if ((!bVar9) || (0xdfff < (ushort)uVar8)) {
      CharSet<unsigned_int>::CloneSimpleCharsTo
                (local_50,pPVar26->ctAllocator,(CharSet<char16_t> *)pNVar33);
      goto LAB_00eccc32;
    }
    CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
              (local_50,pPVar26->ctAllocator,(CharSet<char16_t> *)pNVar33);
    pPVar26 = local_48;
    pNVar21 = (Node *)new<Memory::ArenaAllocator>(0x68,local_48->ctAllocator,0x364470);
    pNVar21->tag = MatchSet;
    pNVar21->features = 0;
    *(uint *)&pNVar21->field_0xc = *(uint *)&pNVar21->field_0xc & 0xffff8000;
    pNVar21->firstSet = (CharSet<char16_t> *)0x0;
    pNVar21->followSet = (CharSet<char16_t> *)0x0;
    (pNVar21->prevConsumes).lower = 0;
    auVar35 = pmovsxbd((undefined1  [16])0x0,0xff00ff);
    *(undefined1 (*) [16])&(pNVar21->prevConsumes).upper = auVar35;
    (pNVar21->followConsumes).upper = 0xffffffff;
    pNVar21->_vptr_Node = (_func_int **)&PTR_LiteralLength_01542af0;
    *(undefined2 *)&pNVar21[1]._vptr_Node = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar21[1].tag);
    CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
              (this_00,pPVar26->ctAllocator,(CharSet<char16_t> *)&pNVar21[1].tag);
  }
  if (pPVar26->unicodeFlagPresent == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = local_40;
    *local_40 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
    if (!bVar9) {
LAB_00ecce8b:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar16 = 0;
  }
  _upperCharOfRange = pNVar21;
  if (pNVar20 == (Node *)0x0) {
    pAVar22 = (AltNode *)0x0;
  }
  else {
    pAVar22 = (AltNode *)new<Memory::ArenaAllocator>(0x60,local_48->ctAllocator,0x364470);
    (pAVar22->super_Node).tag = Alt;
    (pAVar22->super_Node).features = 0;
    puVar1 = &(pAVar22->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (pAVar22->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (pAVar22->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (pAVar22->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(pAVar22->super_Node).prevConsumes.upper = 0xffffffff;
    *(undefined8 *)&(pAVar22->super_Node).thisConsumes.upper = 0xffffffff;
    (pAVar22->super_Node).followConsumes.upper = 0xffffffff;
    (pAVar22->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
    pAVar22->head = pNVar20;
    pAVar22->switchSize = 0;
    pAVar22->tail = (AltNode *)0x0;
    pAVar22->runtimeTrie = (RuntimeCharTrie *)0x0;
    *(undefined8 *)((long)&pAVar22->runtimeTrie + 5) = 0;
  }
  negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
  local_60 = 0;
  bVar9 = CharSet<unsigned_int>::GetNextRange
                    (this_00,0x10000,
                     (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),&local_60);
  pPVar26 = local_48;
  lastAltNode = pAVar22;
  if (bVar9) {
    do {
      if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_60) {
        pAVar23 = AppendSurrogatePairToDisjunction
                            (pPVar26,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                             lastAltNode);
      }
      else {
        pAVar23 = AppendSurrogateRangeToDisjunction
                            (pPVar26,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                             local_60,lastAltNode);
      }
      if (pAVar22 == (AltNode *)0x0) {
        pAVar22 = pAVar23;
      }
      if (pAVar23 == (AltNode *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = local_40;
        *local_40 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
        if (!bVar9) goto LAB_00ecce8b;
        *puVar16 = 0;
      }
      do {
        lastAltNode = pAVar23;
        this_00 = local_50;
        pAVar23 = lastAltNode->tail;
      } while (lastAltNode->tail != (AltNode *)0x0);
      bVar9 = CharSet<unsigned_int>::GetNextRange
                        (local_50,local_60 + 1,
                         (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                         &local_60);
    } while (bVar9);
  }
  pNVar20 = _upperCharOfRange;
  if (_upperCharOfRange != (Node *)0x0) {
    pAVar23 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar26->ctAllocator,0x364470);
    (pAVar23->super_Node).tag = Alt;
    (pAVar23->super_Node).features = 0;
    puVar1 = &(pAVar23->super_Node).field_0xc;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
    (pAVar23->super_Node).firstSet = (CharSet<char16_t> *)0x0;
    (pAVar23->super_Node).followSet = (CharSet<char16_t> *)0x0;
    (pAVar23->super_Node).prevConsumes.lower = 0;
    *(undefined8 *)&(pAVar23->super_Node).prevConsumes.upper = 0xffffffff;
    *(undefined8 *)&(pAVar23->super_Node).thisConsumes.upper = 0xffffffff;
    (pAVar23->super_Node).followConsumes.upper = 0xffffffff;
    (pAVar23->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01542cb0;
    pAVar23->head = pNVar20;
    pAVar23->switchSize = 0;
    pAVar23->tail = (AltNode *)0x0;
    pAVar23->runtimeTrie = (RuntimeCharTrie *)0x0;
    *(undefined8 *)((long)&pAVar23->runtimeTrie + 5) = 0;
    lastAltNode->tail = pAVar23;
    pPVar26 = local_48;
  }
  CharSet<unsigned_int>::Clear(this_00,pPVar26->ctAllocator);
  if (pAVar22 == (AltNode *)0x0) {
    pAVar22 = (AltNode *)0x0;
  }
  else if (pAVar22->tail == (AltNode *)0x0) {
    pAVar22 = (AltNode *)pAVar22->head;
  }
  return &pAVar22->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }